

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcoll.cpp
# Opt level: O0

int __thiscall
CVmObjCollection::get_prop
          (CVmObjCollection *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_obj_id_t in_ECX;
  vm_val_t *in_RDX;
  undefined2 in_SI;
  vm_val_t *in_RDI;
  uint *in_R8;
  CVmObject *unaff_retaddr;
  vm_val_t self_val;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined2 in_stack_fffffffffffffffc;
  undefined2 uVar3;
  vm_prop_id_t in_stack_fffffffffffffffe;
  undefined2 uVar4;
  
  vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffb8,in_ECX);
  iVar1 = const_get_coll_prop((CVmObjCollection *)
                              CONCAT26(in_stack_fffffffffffffffe,
                                       CONCAT24(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                      ),(vm_prop_id_t)((ulong)in_RDI >> 0x30),
                              (vm_val_t *)
                              CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8)),in_RDX,
                              (vm_obj_id_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8);
  if (iVar1 == 0) {
    iVar1 = CVmObject::get_prop(unaff_retaddr,in_stack_fffffffffffffffe,in_RDI,
                                CONCAT22(in_SI,in_stack_ffffffffffffffec),&in_RDX->typ,
                                (uint *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
    uVar3 = (undefined2)iVar1;
    uVar4 = (undefined2)((uint)iVar1 >> 0x10);
  }
  else {
    vVar2 = CVmMetaclass::get_class_obj(in_stack_ffffffffffffffc0);
    *in_R8 = vVar2;
    uVar3 = 1;
    uVar4 = 0;
  }
  return CONCAT22(uVar4,uVar3);
}

Assistant:

int CVmObjCollection::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                               vm_obj_id_t self, vm_obj_id_t *source_obj,
                               uint *argc)
{
    vm_val_t self_val;

    /* set up the 'self' value */
    self_val.set_obj(self);

    /* use the constant collection version */
    if (const_get_coll_prop(vmg_ prop, retval, &self_val, source_obj, argc))
    {
        *source_obj = metaclass_reg_->get_class_obj(vmg0_);
        return TRUE;
    }

    /* inherit default handling */
    return CVmObject::get_prop(vmg_ prop, retval, self, source_obj, argc);
}